

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denoted.c
# Opt level: O0

Denoted * get_denotation_prototype(Map *types)

{
  Denoted *pDVar1;
  Denotation_Prototype *ret;
  Map *types_local;
  
  pDVar1 = (Denoted *)malloc(0x50);
  pDVar1->denotation = DT_Prototype;
  *(undefined8 *)(pDVar1 + 2) = 0;
  *(Map **)(pDVar1 + 4) = types;
  pDVar1[6].denotation = DT_Typedef;
  pDVar1[7].denotation = DT_Struct_Union_Member|DT_Typedef;
  pDVar1[8].denotation = DT_Object;
  pDVar1[9].denotation = DT_Label;
  pDVar1[10].denotation = DT_Macro_Parameter;
  *(undefined8 *)(pDVar1 + 0xc) = 0;
  *(undefined8 *)(pDVar1 + 0xe) = 0;
  *(undefined8 *)(pDVar1 + 0x10) = 0;
  *(undefined1 *)&pDVar1[0x12].denotation = (char)pDVar1[0x12].denotation & 0xfd;
  *(undefined1 *)&pDVar1[0x12].denotation = (char)pDVar1[0x12].denotation & 0xfe;
  return pDVar1;
}

Assistant:

struct Denoted* get_denotation_prototype(struct Map *types)
{
	struct Denotation_Prototype *ret;
	ret=malloc(sizeof(struct Denotation_Prototype));
	ret->denotation=DT_Prototype;
	ret->type=NULL;
	ret->node=types;
	ret->storage_class=SCS_NONE;
	ret->specifier=TS_NONE;
	ret->constraint=TC_NONE;
	ret->sign=TSIGN_NONE;
	ret->function_specifier=FS_None;
	ret->struct_union=NULL;
	ret->enumerator=NULL;
	ret->size=0;
	ret->is_const=ret->is_volatile=0;

	return (struct Denoted*)ret;
}